

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O2

Character ZXing::OneD::ReadDataCharacter(PatternView *view,bool outsideChar,bool rightPair)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Character CVar6;
  uint numModules;
  undefined7 in_register_00000031;
  long lVar7;
  Array4I evnPattern;
  Array4I oddPattern;
  Array4I *counts;
  
  oddPattern._M_elems[0] = 0;
  oddPattern._M_elems[1] = 0;
  oddPattern._M_elems[2] = 0;
  oddPattern._M_elems[3] = 0;
  evnPattern._M_elems[0] = 0;
  evnPattern._M_elems[1] = 0;
  evnPattern._M_elems[2] = 0;
  evnPattern._M_elems[3] = 0;
  numModules = (int)CONCAT71(in_register_00000031,outsideChar) + 0xf;
  counts = (Array4I *)(ulong)numModules;
  bVar1 = DataBar::ReadDataCharacterRaw
                    (view,numModules,rightPair == outsideChar,&oddPattern,&evnPattern);
  CVar6.value = -1;
  CVar6.checksum = 0;
  if (bVar1) {
    iVar2 = ReadDataCharacter::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&oddPattern,counts);
    iVar3 = ReadDataCharacter::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&evnPattern,counts);
    if (outsideChar) {
      iVar4 = Reduce<std::array<int,4ul>,int,std::plus<int>>(&oddPattern,0);
      lVar7 = (long)((0xc - iVar4) / 2);
      iVar4 = *(int *)(&DAT_0019fa40 + lVar7 * 4);
      iVar5 = DataBar::GetValue(&oddPattern,iVar4,false);
      iVar4 = DataBar::GetValue(&evnPattern,9 - iVar4,true);
      iVar4 = iVar5 * *(int *)(&DAT_0019fa00 + lVar7 * 4) + iVar4 +
              *(int *)(&DAT_0019fa20 + lVar7 * 4);
    }
    else {
      iVar4 = Reduce<std::array<int,4ul>,int,std::plus<int>>(&evnPattern,0);
      lVar7 = (long)((10 - iVar4) / 2);
      iVar4 = *(int *)(&DAT_0019f900 + lVar7 * 4);
      iVar5 = DataBar::GetValue(&oddPattern,iVar4,true);
      iVar4 = DataBar::GetValue(&evnPattern,9 - iVar4,false);
      iVar4 = iVar4 * *(int *)(&DAT_0019f8e0 + lVar7 * 4) + iVar5 +
              *(int *)(&DAT_0019f8f0 + lVar7 * 4);
    }
    CVar6.checksum = iVar3 * 3 + iVar2;
    CVar6.value = iVar4;
  }
  return CVar6;
}

Assistant:

static Character ReadDataCharacter(const PatternView& view, bool outsideChar, bool rightPair)
{
	constexpr int OUTSIDE_EVEN_TOTAL_SUBSET[] = {1, 10, 34, 70, 126};
	constexpr int INSIDE_ODD_TOTAL_SUBSET[]   = {4, 20, 48, 81};
	constexpr int OUTSIDE_GSUM[]              = {0, 161, 961, 2015, 2715};
	constexpr int INSIDE_GSUM[]               = {0, 336, 1036, 1516};
	constexpr int OUTSIDE_ODD_WIDEST[]        = {8, 6, 4, 3, 1};
	constexpr int INSIDE_ODD_WIDEST[]         = {2, 4, 6, 8};

	Array4I oddPattern = {}, evnPattern = {};
	if (!ReadDataCharacterRaw(view, outsideChar ? 16 : 15, outsideChar == rightPair, oddPattern, evnPattern))
		return {};

	auto calcChecksumPortion = [](const Array4I& counts) {
		int res = 0;
		for (auto it = counts.rbegin(); it != counts.rend(); ++it)
			res = 9 * res + *it;
		return res;
	};

	int checksumPortion = calcChecksumPortion(oddPattern) + 3 * calcChecksumPortion(evnPattern);

	if (outsideChar) {
		int oddSum = Reduce(oddPattern);
		assert((oddSum & 1) == 0 && oddSum <= 12 && oddSum >= 4); // checked in ReadDataCharacterRaw
		int group = (12 - oddSum) / 2;
		int oddWidest = OUTSIDE_ODD_WIDEST[group];
		int evnWidest = 9 - oddWidest;
		int vOdd = GetValue(oddPattern, oddWidest, false);
		int vEvn = GetValue(evnPattern, evnWidest, true);
		int tEvn = OUTSIDE_EVEN_TOTAL_SUBSET[group];
		int gSum = OUTSIDE_GSUM[group];
		return {vOdd * tEvn + vEvn + gSum, checksumPortion};
	} else {
		int evnSum = Reduce(evnPattern);
		assert((evnSum & 1) == 0 && evnSum <= 12 && evnSum >= 4); // checked in ReadDataCharacterRaw
		int group = (10 - evnSum) / 2;
		int oddWidest = INSIDE_ODD_WIDEST[group];
		int evnWidest = 9 - oddWidest;
		int vOdd = GetValue(oddPattern, oddWidest, true);
		int vEvn = GetValue(evnPattern, evnWidest, false);
		int tOdd = INSIDE_ODD_TOTAL_SUBSET[group];
		int gSum = INSIDE_GSUM[group];
		return {vEvn * tOdd + vOdd + gSum, checksumPortion};
	}
}